

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O2

exr_result_t
exr_uncompress_buffer(void *in,size_t in_bytes,void *out,size_t out_bytes_avail,size_t *actual_out)

{
  int iVar1;
  exr_result_t eVar2;
  long lVar3;
  size_t actual_in_bytes;
  
  lVar3 = libdeflate_alloc_decompressor();
  if (lVar3 == 0) {
    eVar2 = 1;
  }
  else {
    iVar1 = libdeflate_zlib_decompress_ex
                      (lVar3,in,in_bytes,out,out_bytes_avail,&actual_in_bytes,actual_out);
    libdeflate_free_decompressor(lVar3);
    eVar2 = 0;
    if (actual_in_bytes != in_bytes) {
      eVar2 = 0x17;
    }
    if (iVar1 != 0) {
      eVar2 = 0x17;
    }
  }
  return eVar2;
}

Assistant:

exr_result_t exr_uncompress_buffer (
    const void *in,
    size_t in_bytes,
    void *out,
    size_t out_bytes_avail,
    size_t *actual_out )
{
    struct libdeflate_decompressor *decomp;
    enum libdeflate_result res;
    size_t actual_in_bytes;

    decomp = libdeflate_alloc_decompressor ();
    if (decomp)
    {
        res = libdeflate_zlib_decompress_ex (
            decomp,
            in,
            in_bytes,
            out,
            out_bytes_avail,
            &actual_in_bytes,
            actual_out);

        libdeflate_free_decompressor (decomp);

        if (res == LIBDEFLATE_SUCCESS)
        {
            if (in_bytes == actual_in_bytes)
                return EXR_ERR_SUCCESS;
            /* it's an error to not consume the full buffer, right? */
        }
        return EXR_ERR_CORRUPT_CHUNK;
    }
    return EXR_ERR_OUT_OF_MEMORY;
}